

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O3

CURLcode get_server_message(SASL *sasl,Curl_easy *data,bufref *out)

{
  CURLcode CVar1;
  uchar *src;
  size_t msglen;
  uchar *msg;
  size_t local_28;
  uchar *local_20;
  
  CVar1 = (*sasl->params->getmessage)(data,out);
  if ((CVar1 == CURLE_OK) && (CVar1 = CURLE_OK, (sasl->params->flags & 1) != 0)) {
    src = Curl_bufref_ptr(out);
    if ((*src == '=') || (*src == '\0')) {
      CVar1 = CURLE_OK;
      Curl_bufref_set(out,(void *)0x0,0,(_func_void_void_ptr *)0x0);
    }
    else {
      CVar1 = Curl_base64_decode((char *)src,&local_20,&local_28);
      if (CVar1 == CURLE_OK) {
        Curl_bufref_set(out,local_20,local_28,curl_free);
        CVar1 = CURLE_OK;
      }
    }
  }
  return CVar1;
}

Assistant:

static CURLcode get_server_message(struct SASL *sasl, struct Curl_easy *data,
                                   struct bufref *out)
{
  CURLcode result = CURLE_OK;

  result = sasl->params->getmessage(data, out);
  if(!result && (sasl->params->flags & SASL_FLAG_BASE64)) {
    unsigned char *msg;
    size_t msglen;
    const char *serverdata = (const char *) Curl_bufref_ptr(out);

    if(!*serverdata || *serverdata == '=')
      Curl_bufref_set(out, NULL, 0, NULL);
    else {
      result = Curl_base64_decode(serverdata, &msg, &msglen);
      if(!result)
        Curl_bufref_set(out, msg, msglen, curl_free);
    }
  }
  return result;
}